

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaInvPnd.cpp
# Opt level: O3

void NaInvPend::CalcLinMatrices
               (NaReal M,NaReal m,NaReal b,NaReal l,NaReal I,NaReal (*A) [4],NaReal *B)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  dVar7 = m * l;
  dVar4 = dVar7 * l + I;
  dVar8 = I * (M + m) + M * m * l * l;
  (*A)[0] = 0.0;
  (*A)[1] = 1.0;
  (*A)[2] = 0.0;
  (*A)[3] = 0.0;
  lVar2 = 0;
  A[1][0] = 0.0;
  auVar5._0_8_ = b * -dVar4;
  auVar5._8_8_ = l * m * m * 9.8 * l;
  auVar6._8_8_ = dVar8;
  auVar6._0_8_ = dVar8;
  auVar6 = divpd(auVar5,auVar6);
  *(undefined1 (*) [16])(A[1] + 1) = auVar6;
  A[1][3] = 0.0;
  A[2][0] = 0.0;
  A[2][1] = 0.0;
  A[2][2] = 0.0;
  A[2][3] = 1.0;
  A[3][0] = 0.0;
  auVar3._0_8_ = b * -dVar7;
  auVar3._8_8_ = m * 9.8 * l * (M + m);
  auVar1._8_8_ = dVar8;
  auVar1._0_8_ = dVar8;
  auVar6 = divpd(auVar3,auVar1);
  *(undefined1 (*) [16])(A[3] + 1) = auVar6;
  A[3][3] = 0.0;
  NaPrintLog("A:");
  do {
    NaPrintLog("\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",*(undefined8 *)((long)*A + lVar2),
               *(undefined8 *)((long)*A + lVar2 + 8),*(undefined8 *)((long)*A + lVar2 + 0x10),
               *(undefined8 *)((long)*A + lVar2 + 0x18));
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x80);
  *B = 0.0;
  dVar4 = dVar4 / dVar8;
  B[1] = dVar4;
  B[2] = 0.0;
  B[3] = dVar7 / dVar8;
  NaPrintLog("B:\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",0,dVar4,0);
  return;
}

Assistant:

void
NaInvPend::CalcLinMatrices (NaReal M, NaReal m, NaReal b,
			    NaReal l, NaReal I,
			    NaReal A[4][4], NaReal B[4])
{
  NaReal	g = 9.8;
  NaReal	p = I*(m+M)+M*m*l*l;
  A[0][0] = 0;
  A[0][1] = 1;
  A[0][2] = 0;
  A[0][3] = 0;

  A[1][0] = 0;
  A[1][1] = -(I+m*l*l)*b/p;
  A[1][2] = (m*m*g*l*l)/p;
  A[1][3] = 0;

  A[2][0] = 0;
  A[2][1] = 0;
  A[2][2] = 0;
  A[2][3] = 1;

  A[3][0] = 0;
  A[3][1] = -(m*l*b)/p;
  A[3][2] = m*g*l*(M+m)/p;
  A[3][3] = 0;

  NaPrintLog("A:");
  for(int i = 0; i < 4; ++i)
    NaPrintLog("\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",
	       A[i][0], A[i][1], A[i][2], A[i][3]);

  B[0] = 0;
  B[1] = (I+m*l*l)/p;
  B[2] = 0;
  B[3] = m*l/p;

  NaPrintLog("B:\t%7.4f\t%7.4f\t%7.4f\t%7.4f\n",
	     B[0], B[1], B[2], B[3]);
}